

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O0

void __thiscall rw_shared_thread::operator()(rw_shared_thread *this)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  long in_RDI;
  ptime pVar3;
  ostringstream oss;
  ptime end;
  ptime start;
  ptime *in_stack_fffffffffffffd88;
  ptime *in_stack_fffffffffffffd90;
  longlong in_stack_fffffffffffffda0;
  string local_230 [48];
  ostringstream local_200 [376];
  longlong local_88;
  int local_80;
  ptime local_78;
  longlong local_68;
  int local_60;
  ptime local_58;
  undefined1 local_48 [12];
  undefined1 local_38 [12];
  undefined1 local_28 [12];
  undefined1 local_18 [12];
  
  booster::recursive_shared_mutex::shared_lock();
  booster::ptime::millisleep(in_stack_fffffffffffffda0);
  local_28 = booster::ptime::now();
  local_18 = local_28;
  booster::recursive_shared_mutex::shared_lock();
  local_48 = booster::ptime::now();
  local_38 = local_48;
  booster::ptime::millisleep(in_stack_fffffffffffffda0);
  booster::recursive_shared_mutex::unlock();
  booster::recursive_shared_mutex::unlock();
  pVar3 = booster::ptime::operator-(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  local_68 = pVar3.sec;
  local_60 = pVar3.nsec;
  local_58.sec = local_68;
  local_58.nsec = local_60;
  pVar3 = booster::ptime::milliseconds((longlong)in_stack_fffffffffffffd90);
  local_88 = pVar3.sec;
  local_80 = pVar3.nsec;
  local_78.sec = local_88;
  local_78.nsec = local_80;
  bVar1 = booster::ptime::operator<(&local_58,&local_78);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_200);
    poVar2 = std::operator<<((ostream *)local_200,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb1);
    std::operator<<(poVar2," end-start < booster::ptime::milliseconds(100)");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_230);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  **(undefined1 **)(in_RDI + 8) = 1;
  return;
}

Assistant:

void operator()() const
	{
		lp->shared_lock();
		booster::ptime::millisleep(500);
		booster::ptime start = booster::ptime::now();
		lp->shared_lock();
		booster::ptime end = booster::ptime::now();
		booster::ptime::millisleep(200);
		lp->unlock();
		lp->unlock();
		TEST(end-start < booster::ptime::milliseconds(100));
		*done = true;
	}